

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

bool sensors_analytics::HttpSender::EncodeToRequestBody(string *data,string *request_body)

{
  bool bVar1;
  utils local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  undefined1 local_70 [8];
  string base64_encoded_data;
  string local_40 [8];
  string compressed_data;
  string *request_body_local;
  string *data_local;
  
  std::__cxx11::string::string(local_40);
  bVar1 = CompressString(data,(string *)local_40,9);
  if (bVar1) {
    Base64Encode((HttpSender *)local_70,(string *)local_40);
    utils::UrlEncode(local_d0,(string *)local_70);
    std::operator+((char *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"data_list="
                  );
    std::operator+(local_90,(char *)local_b0);
    std::__cxx11::string::operator=((string *)request_body,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::~string(local_40);
  return bVar1;
}

Assistant:

bool HttpSender::EncodeToRequestBody(const string &data, string *request_body) {
  string compressed_data;
  if (!CompressString(data, &compressed_data)) {
    return false;
  }
  const string base64_encoded_data = Base64Encode(compressed_data);
  *request_body = "data_list=" + utils::UrlEncode(base64_encoded_data) + "&gzip=1";
  return true;
}